

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall ON_Material::Internal_ReadV5(ON_Material *this,ON_BinaryArchive *file)

{
  ON_Color *color;
  ON_ObjectArray<ON_Texture> *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ON_UUID *pOVar7;
  wchar_t *component_name;
  ON_Texture *object;
  int minor_version;
  int count;
  int material_index;
  int major_version;
  ON_wString material_name;
  int texmajver;
  int texminver;
  ON_UUID material_id;
  int local_5c;
  ON_wString local_58;
  int local_50;
  int local_4c;
  ON_wString local_48;
  int local_40 [2];
  ON_UUID local_38;
  
  local_4c = 0;
  local_5c = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_4c,&local_5c);
  if (!bVar1) {
    return false;
  }
  if (local_4c != 2) {
    if (local_4c != 1) {
      return true;
    }
    bVar1 = Internal_ReadV3(this,file,local_5c);
    return bVar1;
  }
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&local_4c,&local_5c);
  if (!bVar1) {
    return false;
  }
  pOVar7 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
  local_38.Data1 = pOVar7->Data1;
  local_38.Data2 = pOVar7->Data2;
  local_38.Data3 = pOVar7->Data3;
  local_38.Data4 = *&pOVar7->Data4;
  bVar1 = ON_BinaryArchive::ReadUuid(file,&local_38);
  if (bVar1) {
    ON_ModelComponent::SetId(&this->super_ON_ModelComponent,&local_38);
    local_50 = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
    bVar1 = ON_BinaryArchive::ReadInt(file,&local_50);
    if (!bVar1) goto LAB_004d2b52;
    ON_ModelComponent::SetIndex(&this->super_ON_ModelComponent,local_50);
    ON_wString::ON_wString(&local_48);
    bVar1 = ON_BinaryArchive::ReadString(file,&local_48);
    if (bVar1) {
      component_name = ON_wString::operator_cast_to_wchar_t_(&local_48);
      ON_ModelComponent::SetName(&this->super_ON_ModelComponent,component_name);
      bVar1 = ON_BinaryArchive::ReadUuid(file,&this->m_plugin_id);
      if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_ambient), bVar1)) {
        bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_diffuse);
        if ((bVar1) &&
           (((bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_emission), bVar1 &&
             (bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_specular), bVar1)) &&
            (bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_reflection), bVar1)))) {
          color = &this->m_transparent;
          bVar1 = ON_BinaryArchive::ReadColor(file,color);
          if (bVar1) {
            uVar4 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
            if (((uVar4 < 0xbf9ac8a) && (iVar5 = ON_Color::Red(color), iVar5 == 0x80)) &&
               ((iVar5 = ON_Color::Green(color), iVar5 == 0x80 &&
                (iVar5 = ON_Color::Blue(color), iVar5 == 0x80)))) {
              color->field_0 = (this->m_diffuse).field_0;
            }
            bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_index_of_refraction);
            if (((bVar1) &&
                (bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_reflectivity), bVar1)) &&
               (bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_shine), bVar1)) {
              bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_transparency);
              bVar1 = false;
              if (!bVar2) goto LAB_004d2b5e;
              local_40[0] = 0;
              local_40[1] = 0;
              bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_40,local_40 + 1);
              if (bVar1) {
                bVar2 = true;
                if (local_40[0] == 1) {
                  local_58.m_s._0_4_ = 0;
                  bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_58);
                  if (bVar1) {
                    if ((uint)(this->m_textures).super_ON_ClassArray<ON_Texture>.m_capacity <
                        (uint)local_58.m_s) {
                      ON_ClassArray<ON_Texture>::SetCapacity
                                (&(this->m_textures).super_ON_ClassArray<ON_Texture>,
                                 (long)(int)(uint)local_58.m_s);
                    }
                    bVar2 = true;
                    if (bVar1 && 0 < (int)(uint)local_58.m_s) {
                      this_00 = &this->m_textures;
                      iVar5 = 0;
                      do {
                        object = ON_ClassArray<ON_Texture>::AppendNew
                                           (&this_00->super_ON_ClassArray<ON_Texture>);
                        iVar6 = ON_BinaryArchive::ReadObject(file,&object->super_ON_Object);
                        if (iVar6 < 1) {
                          ON_ClassArray<ON_Texture>::Remove
                                    (&this_00->super_ON_ClassArray<ON_Texture>,
                                     (this->m_textures).super_ON_ClassArray<ON_Texture>.m_count + -1
                                    );
                          goto LAB_004d2b97;
                        }
                        if (iVar6 != 1) {
                          ON_ClassArray<ON_Texture>::Remove
                                    (&this_00->super_ON_ClassArray<ON_Texture>,
                                     (this->m_textures).super_ON_ClassArray<ON_Texture>.m_count + -1
                                    );
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < (int)(uint)local_58.m_s);
                    }
                  }
                  else {
LAB_004d2b97:
                    bVar2 = false;
                  }
                }
                bVar3 = ON_BinaryArchive::EndRead3dmChunk(file);
                bVar1 = false;
                if (bVar3) {
                  bVar1 = bVar2;
                }
                if ((bVar1 != true) || (local_5c < 1)) goto LAB_004d2b5e;
                ON_wString::ON_wString(&local_58);
                bVar1 = ON_BinaryArchive::ReadString(file,&local_58);
                if ((bVar1 && 1 < local_5c) &&
                   (bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_material_channel),
                   2 < local_5c && bVar1)) {
                  bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bShareable);
                  if (bVar1) {
                    bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bDisableLighting);
                    if (3 < local_5c && bVar1) {
                      bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bFresnelReflections);
                      if ((((!bVar1) ||
                           (bVar1 = ON_BinaryArchive::ReadDouble
                                              (file,&this->m_reflection_glossiness), !bVar1)) ||
                          (bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_refraction_glossiness)
                          , !bVar1)) ||
                         (bVar1 = ON_BinaryArchive::ReadDouble
                                            (file,&this->m_fresnel_index_of_refraction), !bVar1))
                      goto LAB_004d2cca;
                      bVar1 = true;
                      if (4 < local_5c) {
                        bVar2 = ON_BinaryArchive::ReadUuid(file,&this->m_rdk_material_instance_id);
                        if (!bVar2) goto LAB_004d2cca;
                        if (5 < local_5c) {
                          bVar1 = ON_BinaryArchive::ReadBool
                                            (file,&this->
                                                  m_bUseDiffuseTextureAlphaForObjectTransparencyTexture
                                            );
                        }
                      }
                    }
                  }
                  else {
LAB_004d2cca:
                    bVar1 = false;
                  }
                }
                ON_wString::~ON_wString(&local_58);
                goto LAB_004d2b5e;
              }
            }
          }
        }
      }
    }
  }
  else {
    local_50 = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
LAB_004d2b52:
    ON_wString::ON_wString(&local_48);
  }
  bVar1 = false;
LAB_004d2b5e:
  ON_wString::~ON_wString(&local_48);
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_Material::Internal_ReadV5( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc)
  {
    if ( 1 == major_version )
    {
      rc = Internal_ReadV3(file,minor_version);
    }
    else if ( 2 == major_version )
    {
      // fancy V4 material
      // V4 file format

      // The chunk version 2.0 prevents old V3 IO code from attempting
      // to read this material
      rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
      if (rc)
      {
        for(;;)
        {
          ON_UUID material_id = Id();
          if ( rc ) rc = file.ReadUuid(material_id);
          if (rc) SetId(material_id);

          int material_index = Index();
          if ( rc ) rc = file.ReadInt(&material_index);
          if (rc) SetIndex(material_index);

          ON_wString material_name;
          if ( rc ) rc = file.ReadString(material_name);
          if (rc) SetName(material_name);

          if ( rc ) rc = file.ReadUuid(m_plugin_id);

          if ( rc ) rc = file.ReadColor( m_ambient );
          if ( rc ) rc = file.ReadColor( m_diffuse );
          if ( rc ) rc = file.ReadColor( m_emission );
          if ( rc ) rc = file.ReadColor( m_specular );
          if ( rc ) rc = file.ReadColor( m_reflection );
          if ( rc ) rc = file.ReadColor( m_transparent );

          if ( rc
               && file.ArchiveOpenNURBSVersion() < 200912010
               && 128 == m_transparent.Red()
               && 128 == m_transparent.Green()
               && 128 == m_transparent.Blue()
               )
          {
            // Prior to 1 Dec 2009 the ON_Material::Defaults() set
            // m_transparent to 128,128,128.  This was the wrong
            // value for the default.  This "hack" is here to
            // make it appear that the default was always white.
            m_transparent = m_diffuse;
          }

          if ( rc ) rc = file.ReadDouble( &m_index_of_refraction );
          if ( rc ) rc = file.ReadDouble( &m_reflectivity );
          if ( rc ) rc = file.ReadDouble( &m_shine );
          if ( rc ) rc = file.ReadDouble( &m_transparency );

          if ( !rc )
            break;

          // array of textures read in a way that user data persists
          int texmajver = 0;
          int texminver = 0;
          rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&texmajver,&texminver);
          if (rc)
          {
            if ( 1 == texmajver )
            {
              int i, count = 0;
              rc = file.ReadInt(&count);
              if (rc) m_textures.Reserve(count);
              for ( i = 0; i < count && rc; i++ )
              {
                int trc = file.ReadObject(m_textures.AppendNew());
                if (trc <= 0)
                {
                  // http://mcneel.myjetbrains.com/youtrack/issue/RH-30204
                  // Part of fixing crash reading corrupt file sem2observe copy.3dm
                  rc = false;
                  m_textures.Remove();
                }
                else if ( trc > 1 )
                  m_textures.Remove();
              }
            }
            if ( !file.EndRead3dmChunk() )
              rc = false;
          }

          if ( rc && minor_version >= 1 )
          {
            ON_wString obsolete_flamingo_library;
            rc = file.ReadString(obsolete_flamingo_library);
            if ( !rc ) break;

            if ( minor_version >= 2 )
            {
              // version 1.2 field (20061113)
              rc = file.ReadArray(m_material_channel);
              if (!rc) break;

              if ( minor_version >= 3 )
              {
                // version 1.3 fields (20100917*)
                rc = file.ReadBool(&m_bShareable);
                if (!rc) break;
                rc = file.ReadBool(&m_bDisableLighting);
                if (!rc) break;
                if ( minor_version >= 4 )
                {
                  rc = file.ReadBool(&m_bFresnelReflections);
                  if (!rc) break;
                  rc = file.ReadDouble(&m_reflection_glossiness);
                  if (!rc) break;
                  rc = file.ReadDouble(&m_refraction_glossiness);
                  if (!rc) break;
                  rc = file.ReadDouble(&m_fresnel_index_of_refraction);
                  if (!rc) break;

                  if (minor_version >= 5)
                  {
                    // version 1.5 field 6.0.2014-05-16
                    rc = file.ReadUuid(m_rdk_material_instance_id);
                    if (!rc) break;
                  }

                  if (minor_version >= 6)
                  {
                    // version 1.6 field 6.0.2014-07-11
                    rc = file.ReadBool(&m_bUseDiffuseTextureAlphaForObjectTransparencyTexture);
                    if (!rc) break;
                  }
                }
              }
            }

          }

          break;
        }
        if (!file.EndRead3dmChunk() )
          rc = false;
      }
    }
  }
  return rc;
}